

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::RangeEnc_EncodeDirectBits(CRangeEnc *p,UInt32 value,int numBits)

{
  int local_18;
  int numBits_local;
  UInt32 value_local;
  CRangeEnc *p_local;
  
  local_18 = numBits;
  do {
    p->range = p->range >> 1;
    local_18 = local_18 + -1;
    p->low = (ulong)(p->range & -(value >> ((byte)local_18 & 0x1f) & 1)) + p->low;
    if (p->range < 0x1000000) {
      p->range = p->range << 8;
      RangeEnc_ShiftLow(p);
    }
  } while (local_18 != 0);
  return;
}

Assistant:

static void RangeEnc_EncodeDirectBits(CRangeEnc* p, UInt32 value, int numBits) {
  do {
    p->range >>= 1;
    p->low += p->range & (0 - ((value >> --numBits) & 1));
    if (p->range < kTopValue) {
      p->range <<= 8;
      RangeEnc_ShiftLow(p);
    }
  } while (numBits != 0);
}